

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse2_128_16.c
# Opt level: O0

parasail_result_t *
parasail_nw_table_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  longlong lVar4;
  longlong lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  longlong lVar23;
  longlong lVar24;
  ushort uVar25;
  short sVar26;
  ushort uVar27;
  int iVar28;
  int iVar29;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int32_t in_R9D;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar36;
  ushort uVar37;
  undefined1 auVar30 [16];
  ushort uVar38;
  ulong uVar35;
  undefined1 auVar39 [16];
  __m128i alVar40;
  int32_t in_stack_fffffffffffff888;
  long local_768;
  long local_760;
  ulong uStack_748;
  __m128i vH_1;
  __m128i vFt;
  __m128i vW;
  __m128i *pvW;
  __m128i vHp;
  __m128i vH;
  __m128i vF;
  __m128i vHt;
  __m128i vE;
  __m128i vGapper;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_16_t e;
  __m128i_16_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_5fa;
  int16_t score;
  __m128i vZero;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvGapper;
  __m128i *pvH;
  __m128i *pvHt;
  int16_t *boundary;
  __m128i *pvE;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_560;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_268;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_260;
  short sStack_25e;
  short sStack_25c;
  short sStack_25a;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  short sStack_21a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_scan_profile_sse2_128_16","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_scan_profile_sse2_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_scan_profile_sse2_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_scan_profile_sse2_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_scan_profile_sse2_128_16","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_scan_profile_sse2_128_16","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_scan_profile_sse2_128_16","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_scan_profile_sse2_128_16","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_560 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar2 = profile->matrix;
    iVar28 = (iVar1 + 7) / 8;
    pvVar3 = (profile->profile16).score;
    i._0_2_ = (short)open;
    uVar19 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    uVar20 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    j._0_2_ = (short)gap;
    uVar21 = CONCAT26((short)j,CONCAT24((short)j,CONCAT22((short)j,(short)j)));
    uVar22 = CONCAT26((short)j,CONCAT24((short)j,CONCAT22((short)j,(short)j)));
    if (ppVar2->min <= -open) {
      i._0_2_ = -(short)ppVar2->min;
    }
    uVar25 = (short)i + 0x8001;
    sVar26 = ((ushort)ppVar2->max ^ 0x7fff) - 1;
    lVar23 = CONCAT26(uVar25,CONCAT24(uVar25,CONCAT22(uVar25,uVar25)));
    lVar24 = CONCAT26(uVar25,CONCAT24(uVar25,CONCAT22(uVar25,uVar25)));
    vSaturationCheckMax[1] = CONCAT26(sVar26,CONCAT24(sVar26,CONCAT22(sVar26,sVar26)));
    vSaturationCheckMin[0] = CONCAT26(sVar26,CONCAT24(sVar26,CONCAT22(sVar26,sVar26)));
    vSegLenXgap[1] = CONCAT62(0,uVar25);
    uVar27 = -(short)iVar28 * (short)j;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = vSegLenXgap[1];
    auVar30._8_8_ =
         CONCAT26(uVar27,CONCAT24(uVar27,CONCAT22(uVar27,uVar27))) << 0x10 | (ulong)uVar27;
    auVar30._0_8_ = CONCAT26(uVar27,CONCAT24(uVar27,CONCAT22(uVar27,uVar27))) << 0x10;
    _result = paddsw(auVar39,auVar30);
    _segNum = (parasail_profile_t *)parasail_result_new_table1(iVar28 * 8,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x8200401;
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x20000;
      ptr = parasail_memalign___m128i(0x10,(long)iVar28);
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 1));
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar28);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar28);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar28);
      if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.m[1]._4_4_ = 0;
        for (k = 0; k < iVar28; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 8; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            local_768 = (long)(-(gap * (h.m[1]._0_4_ * iVar28 + k)) - open);
            local_760 = local_768;
            if (local_768 < -0x8000) {
              local_760 = -0x8000;
            }
            *(short *)((long)&e + (long)(int)h.m[1]._0_4_ * 2 + 8) = (short)local_760;
            local_768 = local_768 - open;
            if (local_768 < -0x8000) {
              local_768 = -0x8000;
            }
            *(short *)((long)&tmp + (long)(int)h.m[1]._0_4_ * 2) = (short)local_768;
          }
          ptr_02[(int)h.m[1]._4_4_][0] = e.m[1];
          ptr_02[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          iVar29 = -(gap * (k + -1)) - open;
          if (iVar29 < -0x8000) {
            iVar29 = -0x8000;
          }
          ptr_00[k] = (int16_t)iVar29;
        }
        auVar17._8_8_ = uVar20;
        auVar17._0_8_ = uVar19;
        register0x00001200 = psubsw(ZEXT816(0),auVar17);
        k = iVar28;
        while (k = k + -1, -1 < k) {
          ptr_03[k][0] = vE[1];
          ptr_03[k][1] = vGapper[0];
          auVar16._8_8_ = uVar22;
          auVar16._0_8_ = uVar21;
          register0x00001200 = psubsw(stack0xfffffffffffff948,auVar16);
        }
        vNegInfFront[1] = lVar23;
        vSaturationCheckMax[0] = lVar24;
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          uVar35 = ptr_02[iVar28 + -1][0];
          vHp[0] = ptr_02[iVar28 + -1][1] << 0x10 | uVar35 >> 0x30;
          pvW = (__m128i *)(uVar35 << 0x10 | (ulong)(ushort)ptr_00[s1Len]);
          iVar29 = ppVar2->mapper[(byte)s2[s1Len]];
          auVar15._8_8_ = lVar24;
          auVar15._0_8_ = lVar23;
          register0x00001200 = psubsw(auVar15,(undefined1  [16])*ptr_03);
          vF[0] = lVar24;
          vH[1] = lVar23;
          k = 0;
          while( true ) {
            local_188 = (short)vH[1];
            sStack_186 = vH[1]._2_2_;
            sStack_184 = vH[1]._4_2_;
            sStack_182 = vH[1]._6_2_;
            sStack_180 = (short)vH[2];
            sStack_17e = vH[2]._2_2_;
            sStack_17c = vH[2]._4_2_;
            sStack_17a = vH[2]._6_2_;
            if (iVar28 <= k) break;
            alVar40 = ptr_02[k];
            auVar14._8_8_ = uVar22;
            auVar14._0_8_ = uVar21;
            auVar39 = psubsw((undefined1  [16])ptr[k],auVar14);
            auVar13._8_8_ = uVar20;
            auVar13._0_8_ = uVar19;
            auVar30 = psubsw((undefined1  [16])ptr_02[k],auVar13);
            local_168 = auVar39._0_2_;
            sStack_166 = auVar39._2_2_;
            sStack_164 = auVar39._4_2_;
            sStack_162 = auVar39._6_2_;
            sStack_160 = auVar39._8_2_;
            sStack_15e = auVar39._10_2_;
            sStack_15c = auVar39._12_2_;
            sStack_15a = auVar39._14_2_;
            local_178 = auVar30._0_2_;
            sStack_176 = auVar30._2_2_;
            sStack_174 = auVar30._4_2_;
            sStack_172 = auVar30._6_2_;
            sStack_170 = auVar30._8_2_;
            sStack_16e = auVar30._10_2_;
            sStack_16c = auVar30._12_2_;
            sStack_16a = auVar30._14_2_;
            uVar27 = (ushort)(local_168 < local_178) * local_178 |
                     (ushort)(local_168 >= local_178) * local_168;
            uVar31 = (ushort)(sStack_166 < sStack_176) * sStack_176 |
                     (ushort)(sStack_166 >= sStack_176) * sStack_166;
            uVar32 = (ushort)(sStack_164 < sStack_174) * sStack_174 |
                     (ushort)(sStack_164 >= sStack_174) * sStack_164;
            uVar33 = (ushort)(sStack_162 < sStack_172) * sStack_172 |
                     (ushort)(sStack_162 >= sStack_172) * sStack_162;
            uVar34 = (ushort)(sStack_160 < sStack_170) * sStack_170 |
                     (ushort)(sStack_160 >= sStack_170) * sStack_160;
            uVar36 = (ushort)(sStack_15e < sStack_16e) * sStack_16e |
                     (ushort)(sStack_15e >= sStack_16e) * sStack_15e;
            uVar37 = (ushort)(sStack_15c < sStack_16c) * sStack_16c |
                     (ushort)(sStack_15c >= sStack_16c) * sStack_15c;
            uVar38 = (ushort)(sStack_15a < sStack_16a) * sStack_16a |
                     (ushort)(sStack_15a >= sStack_16a) * sStack_15a;
            vHt[1] = CONCAT26(uVar33,CONCAT24(uVar32,CONCAT22(uVar31,uVar27)));
            vE[0] = CONCAT26(uVar38,CONCAT24(uVar37,CONCAT22(uVar36,uVar34)));
            auVar30 = paddsw((undefined1  [16])_pvW,
                             *(undefined1 (*) [16])
                              ((long)pvVar3 + (long)k * 0x10 + (long)(iVar29 * iVar28) * 0x10));
            auVar39 = paddsw(stack0xfffffffffffff928,(undefined1  [16])ptr_03[k]);
            local_198 = auVar39._0_2_;
            sStack_196 = auVar39._2_2_;
            sStack_194 = auVar39._4_2_;
            sStack_192 = auVar39._6_2_;
            sStack_190 = auVar39._8_2_;
            sStack_18e = auVar39._10_2_;
            sStack_18c = auVar39._12_2_;
            sStack_18a = auVar39._14_2_;
            vH[1]._0_4_ = CONCAT22((ushort)(sStack_186 < sStack_196) * sStack_196 |
                                   (ushort)(sStack_186 >= sStack_196) * sStack_186,
                                   (ushort)(local_188 < local_198) * local_198 |
                                   (ushort)(local_188 >= local_198) * local_188);
            vH[1]._0_6_ = CONCAT24((ushort)(sStack_184 < sStack_194) * sStack_194 |
                                   (ushort)(sStack_184 >= sStack_194) * sStack_184,(undefined4)vH[1]
                                  );
            vH[1] = CONCAT26((ushort)(sStack_182 < sStack_192) * sStack_192 |
                             (ushort)(sStack_182 >= sStack_192) * sStack_182,(undefined6)vH[1]);
            vF[0]._0_2_ = (ushort)(sStack_180 < sStack_190) * sStack_190 |
                          (ushort)(sStack_180 >= sStack_190) * sStack_180;
            vF[0]._2_2_ = (ushort)(sStack_17e < sStack_18e) * sStack_18e |
                          (ushort)(sStack_17e >= sStack_18e) * sStack_17e;
            vF[0]._4_2_ = (ushort)(sStack_17c < sStack_18c) * sStack_18c |
                          (ushort)(sStack_17c >= sStack_18c) * sStack_17c;
            vF[0]._6_2_ = (ushort)(sStack_17a < sStack_18a) * sStack_18a |
                          (ushort)(sStack_17a >= sStack_18a) * sStack_17a;
            local_1b8 = auVar30._0_2_;
            sStack_1b6 = auVar30._2_2_;
            sStack_1b4 = auVar30._4_2_;
            sStack_1b2 = auVar30._6_2_;
            sStack_1b0 = auVar30._8_2_;
            sStack_1ae = auVar30._10_2_;
            sStack_1ac = auVar30._12_2_;
            sStack_1aa = auVar30._14_2_;
            vF[1] = CONCAT26((ushort)((short)uVar33 < sStack_1b2) * sStack_1b2 |
                             ((short)uVar33 >= sStack_1b2) * uVar33,
                             CONCAT24((ushort)((short)uVar32 < sStack_1b4) * sStack_1b4 |
                                      ((short)uVar32 >= sStack_1b4) * uVar32,
                                      CONCAT22((ushort)((short)uVar31 < sStack_1b6) * sStack_1b6 |
                                               ((short)uVar31 >= sStack_1b6) * uVar31,
                                               (ushort)((short)uVar27 < local_1b8) * local_1b8 |
                                               ((short)uVar27 >= local_1b8) * uVar27)));
            vHt[0]._0_2_ = (ushort)((short)uVar34 < sStack_1b0) * sStack_1b0 |
                           ((short)uVar34 >= sStack_1b0) * uVar34;
            vHt[0]._2_2_ = (ushort)((short)uVar36 < sStack_1ae) * sStack_1ae |
                           ((short)uVar36 >= sStack_1ae) * uVar36;
            vHt[0]._4_2_ = (ushort)((short)uVar37 < sStack_1ac) * sStack_1ac |
                           ((short)uVar37 >= sStack_1ac) * uVar37;
            vHt[0]._6_2_ = (ushort)((short)uVar38 < sStack_1aa) * sStack_1aa |
                           ((short)uVar38 >= sStack_1aa) * uVar38;
            ptr[k][0] = vHt[1];
            ptr[k][1] = vE[0];
            ptr_01[k][0] = vF[1];
            ptr_01[k][1] = vHt[0];
            k = k + 1;
            _pvW = alVar40;
          }
          uVar27 = ptr_00[(long)s1Len + 1];
          auVar9._8_8_ = vHt[0] << 0x10 | (ulong)vF[1] >> 0x30;
          auVar9._0_8_ = vF[1] << 0x10 | (ulong)uVar27;
          auVar30 = paddsw(auVar9,(undefined1  [16])*ptr_03);
          local_1d8 = auVar30._0_2_;
          sStack_1d6 = auVar30._2_2_;
          sStack_1d4 = auVar30._4_2_;
          sStack_1d2 = auVar30._6_2_;
          sStack_1d0 = auVar30._8_2_;
          sStack_1ce = auVar30._10_2_;
          sStack_1cc = auVar30._12_2_;
          sStack_1ca = auVar30._14_2_;
          vH[1]._0_4_ = CONCAT22((ushort)(sStack_186 < sStack_1d6) * sStack_1d6 |
                                 (ushort)(sStack_186 >= sStack_1d6) * sStack_186,
                                 (ushort)(local_188 < local_1d8) * local_1d8 |
                                 (ushort)(local_188 >= local_1d8) * local_188);
          vH[1]._0_6_ = CONCAT24((ushort)(sStack_184 < sStack_1d4) * sStack_1d4 |
                                 (ushort)(sStack_184 >= sStack_1d4) * sStack_184,(undefined4)vH[1]);
          vH[1] = CONCAT26((ushort)(sStack_182 < sStack_1d2) * sStack_1d2 |
                           (ushort)(sStack_182 >= sStack_1d2) * sStack_182,(undefined6)vH[1]);
          vF[0]._0_2_ = (ushort)(sStack_180 < sStack_1d0) * sStack_1d0 |
                        (ushort)(sStack_180 >= sStack_1d0) * sStack_180;
          vF[0]._2_2_ = (ushort)(sStack_17e < sStack_1ce) * sStack_1ce |
                        (ushort)(sStack_17e >= sStack_1ce) * sStack_17e;
          vF[0]._4_2_ = (ushort)(sStack_17c < sStack_1cc) * sStack_1cc |
                        (ushort)(sStack_17c >= sStack_1cc) * sStack_17c;
          vF[0]._6_2_ = (ushort)(sStack_17a < sStack_1ca) * sStack_1ca |
                        (ushort)(sStack_17a >= sStack_1ca) * sStack_17a;
          k = 0;
          while( true ) {
            if (5 < k) break;
            auVar8._8_8_ = vF[0] << 0x10 | (ulong)vH[1] >> 0x30;
            auVar8._0_8_ = vH[1] << 0x10;
            auVar30 = paddsw(auVar8,_result);
            local_1e8 = (short)vH[1];
            sStack_1e6 = vH[1]._2_2_;
            sStack_1e4 = vH[1]._4_2_;
            sStack_1e2 = vH[1]._6_2_;
            sStack_1e0 = (short)vH[2];
            sStack_1de = vH[2]._2_2_;
            sStack_1dc = vH[2]._4_2_;
            sStack_1da = vH[2]._6_2_;
            local_1f8 = auVar30._0_2_;
            sStack_1f6 = auVar30._2_2_;
            sStack_1f4 = auVar30._4_2_;
            sStack_1f2 = auVar30._6_2_;
            sStack_1f0 = auVar30._8_2_;
            sStack_1ee = auVar30._10_2_;
            sStack_1ec = auVar30._12_2_;
            sStack_1ea = auVar30._14_2_;
            vH[1]._0_4_ = CONCAT22((ushort)(sStack_1e6 < sStack_1f6) * sStack_1f6 |
                                   (ushort)(sStack_1e6 >= sStack_1f6) * sStack_1e6,
                                   (ushort)(local_1e8 < local_1f8) * local_1f8 |
                                   (ushort)(local_1e8 >= local_1f8) * local_1e8);
            vH[1]._0_6_ = CONCAT24((ushort)(sStack_1e4 < sStack_1f4) * sStack_1f4 |
                                   (ushort)(sStack_1e4 >= sStack_1f4) * sStack_1e4,(undefined4)vH[1]
                                  );
            vH[1] = CONCAT26((ushort)(sStack_1e2 < sStack_1f2) * sStack_1f2 |
                             (ushort)(sStack_1e2 >= sStack_1f2) * sStack_1e2,(undefined6)vH[1]);
            vF[0]._0_2_ = (ushort)(sStack_1e0 < sStack_1f0) * sStack_1f0 |
                          (ushort)(sStack_1e0 >= sStack_1f0) * sStack_1e0;
            vF[0]._2_2_ = (ushort)(sStack_1de < sStack_1ee) * sStack_1ee |
                          (ushort)(sStack_1de >= sStack_1ee) * sStack_1de;
            vF[0]._4_2_ = (ushort)(sStack_1dc < sStack_1ec) * sStack_1ec |
                          (ushort)(sStack_1dc >= sStack_1ec) * sStack_1dc;
            vF[0]._6_2_ = (ushort)(sStack_1da < sStack_1ea) * sStack_1ea |
                          (ushort)(sStack_1da >= sStack_1ea) * sStack_1da;
            k = k + 1;
          }
          auVar7._8_8_ = vF[0] << 0x10 | (ulong)vH[1] >> 0x30;
          auVar7._0_8_ = vH[1] << 0x10;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = vSegLenXgap[1];
          register0x00001200 = paddsw(auVar7,auVar6);
          sStack_206 = (short)vF[1];
          sStack_204 = vF[1]._2_2_;
          sStack_202 = vF[1]._4_2_;
          sStack_200 = vF[1]._6_2_;
          sStack_1fe = (short)vF[2];
          sStack_1fc = vF[2]._2_2_;
          sStack_1fa = vF[2]._4_2_;
          local_218 = (short)vH[1];
          sStack_216 = vH[1]._2_2_;
          sStack_214 = vH[1]._4_2_;
          sStack_212 = vH[1]._6_2_;
          sStack_210 = (short)vH[2];
          sStack_20e = vH[2]._2_2_;
          sStack_20c = vH[2]._4_2_;
          sStack_20a = vH[2]._6_2_;
          vHp[1]._0_4_ = CONCAT22((ushort)(sStack_206 < sStack_216) * sStack_216 |
                                  (ushort)(sStack_206 >= sStack_216) * sStack_206,
                                  (ushort)((short)uVar27 < local_218) * local_218 |
                                  ((short)uVar27 >= local_218) * uVar27);
          vHp[1]._0_6_ = CONCAT24((ushort)(sStack_204 < sStack_214) * sStack_214 |
                                  (ushort)(sStack_204 >= sStack_214) * sStack_204,(undefined4)vHp[1]
                                 );
          vHp[1] = CONCAT26((ushort)(sStack_202 < sStack_212) * sStack_212 |
                            (ushort)(sStack_202 >= sStack_212) * sStack_202,(undefined6)vHp[1]);
          vH[0]._0_4_ = CONCAT22((ushort)(sStack_1fe < sStack_20e) * sStack_20e |
                                 (ushort)(sStack_1fe >= sStack_20e) * sStack_1fe,
                                 (ushort)(sStack_200 < sStack_210) * sStack_210 |
                                 (ushort)(sStack_200 >= sStack_210) * sStack_200);
          vH[0]._0_6_ = CONCAT24((ushort)(sStack_1fc < sStack_20c) * sStack_20c |
                                 (ushort)(sStack_1fc >= sStack_20c) * sStack_1fc,(undefined4)vH[0]);
          vH[0] = CONCAT26((ushort)(sStack_1fa < sStack_20a) * sStack_20a |
                           (ushort)(sStack_1fa >= sStack_20a) * sStack_1fa,(undefined6)vH[0]);
          for (k = 0; k < iVar28; k = k + 1) {
            lVar4 = ptr_01[k][0];
            lVar5 = ptr_01[k][1];
            auVar12._8_8_ = uVar22;
            auVar12._0_8_ = uVar21;
            auVar39 = psubsw(stack0xfffffffffffff918,auVar12);
            auVar11._8_8_ = vH[0];
            auVar11._0_8_ = vHp[1];
            auVar10._8_8_ = uVar20;
            auVar10._0_8_ = uVar19;
            auVar30 = psubsw(auVar11,auVar10);
            local_228 = auVar39._0_2_;
            sStack_226 = auVar39._2_2_;
            sStack_224 = auVar39._4_2_;
            sStack_222 = auVar39._6_2_;
            sStack_220 = auVar39._8_2_;
            sStack_21e = auVar39._10_2_;
            sStack_21c = auVar39._12_2_;
            sStack_21a = auVar39._14_2_;
            local_238 = auVar30._0_2_;
            sStack_236 = auVar30._2_2_;
            sStack_234 = auVar30._4_2_;
            sStack_232 = auVar30._6_2_;
            sStack_230 = auVar30._8_2_;
            sStack_22e = auVar30._10_2_;
            sStack_22c = auVar30._12_2_;
            sStack_22a = auVar30._14_2_;
            uVar27 = (ushort)(local_228 < local_238) * local_238 |
                     (ushort)(local_228 >= local_238) * local_228;
            uVar31 = (ushort)(sStack_226 < sStack_236) * sStack_236 |
                     (ushort)(sStack_226 >= sStack_236) * sStack_226;
            uVar32 = (ushort)(sStack_224 < sStack_234) * sStack_234 |
                     (ushort)(sStack_224 >= sStack_234) * sStack_224;
            uVar33 = (ushort)(sStack_222 < sStack_232) * sStack_232 |
                     (ushort)(sStack_222 >= sStack_232) * sStack_222;
            vF[0]._0_2_ = (ushort)(sStack_220 < sStack_230) * sStack_230 |
                          (ushort)(sStack_220 >= sStack_230) * sStack_220;
            vF[0]._2_2_ = (ushort)(sStack_21e < sStack_22e) * sStack_22e |
                          (ushort)(sStack_21e >= sStack_22e) * sStack_21e;
            vF[0]._4_2_ = (ushort)(sStack_21c < sStack_22c) * sStack_22c |
                          (ushort)(sStack_21c >= sStack_22c) * sStack_21c;
            vF[0]._6_2_ = (ushort)(sStack_21a < sStack_22a) * sStack_22a |
                          (ushort)(sStack_21a >= sStack_22a) * sStack_21a;
            vH[1]._0_4_ = CONCAT22(uVar31,uVar27);
            vH[1]._0_6_ = CONCAT24(uVar32,(undefined4)vH[1]);
            vH[1] = CONCAT26(uVar33,(undefined6)vH[1]);
            local_248 = (short)lVar4;
            sStack_246 = (short)((ulong)lVar4 >> 0x10);
            sStack_244 = (short)((ulong)lVar4 >> 0x20);
            sStack_242 = (short)((ulong)lVar4 >> 0x30);
            sStack_240 = (short)lVar5;
            sStack_23e = (short)((ulong)lVar5 >> 0x10);
            sStack_23c = (short)((ulong)lVar5 >> 0x20);
            sStack_23a = (short)((ulong)lVar5 >> 0x30);
            uVar27 = (local_248 < (short)uVar27) * uVar27 |
                     (ushort)(local_248 >= (short)uVar27) * local_248;
            uVar31 = (sStack_246 < (short)uVar31) * uVar31 |
                     (ushort)(sStack_246 >= (short)uVar31) * sStack_246;
            uVar32 = (sStack_244 < (short)uVar32) * uVar32 |
                     (ushort)(sStack_244 >= (short)uVar32) * sStack_244;
            uVar33 = (sStack_242 < (short)uVar33) * uVar33 |
                     (ushort)(sStack_242 >= (short)uVar33) * sStack_242;
            uVar34 = (sStack_240 < (short)(ushort)vF[0]) * (ushort)vF[0] |
                     (ushort)(sStack_240 >= (short)(ushort)vF[0]) * sStack_240;
            uVar36 = (sStack_23e < (short)vF[0]._2_2_) * vF[0]._2_2_ |
                     (ushort)(sStack_23e >= (short)vF[0]._2_2_) * sStack_23e;
            uVar37 = (sStack_23c < (short)vF[0]._4_2_) * vF[0]._4_2_ |
                     (ushort)(sStack_23c >= (short)vF[0]._4_2_) * sStack_23c;
            uVar38 = (sStack_23a < (short)vF[0]._6_2_) * vF[0]._6_2_ |
                     (ushort)(sStack_23a >= (short)vF[0]._6_2_) * sStack_23a;
            vHp[1]._0_4_ = CONCAT22(uVar31,uVar27);
            vHp[1]._0_6_ = CONCAT24(uVar32,(undefined4)vHp[1]);
            vHp[1] = CONCAT26(uVar33,(undefined6)vHp[1]);
            vH[0]._0_4_ = CONCAT22(uVar36,uVar34);
            vH[0]._0_6_ = CONCAT24(uVar37,(undefined4)vH[0]);
            vH[0] = CONCAT26(uVar38,(undefined6)vH[0]);
            ptr_02[k][0] = vHp[1];
            ptr_02[k][1] = vH[0];
            local_148 = (short)vSaturationCheckMax[1];
            sStack_146 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
            sStack_144 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
            sStack_142 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
            sStack_140 = (short)vSaturationCheckMin[0];
            sStack_13e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
            sStack_13c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
            sStack_13a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
            vSaturationCheckMax[1] =
                 CONCAT26(((short)uVar33 < sStack_142) * uVar33 |
                          (ushort)((short)uVar33 >= sStack_142) * sStack_142,
                          CONCAT24(((short)uVar32 < sStack_144) * uVar32 |
                                   (ushort)((short)uVar32 >= sStack_144) * sStack_144,
                                   CONCAT22(((short)uVar31 < sStack_146) * uVar31 |
                                            (ushort)((short)uVar31 >= sStack_146) * sStack_146,
                                            ((short)uVar27 < local_148) * uVar27 |
                                            (ushort)((short)uVar27 >= local_148) * local_148)));
            vSaturationCheckMin[0] =
                 CONCAT26(((short)uVar38 < sStack_13a) * uVar38 |
                          (ushort)((short)uVar38 >= sStack_13a) * sStack_13a,
                          CONCAT24(((short)uVar37 < sStack_13c) * uVar37 |
                                   (ushort)((short)uVar37 >= sStack_13c) * sStack_13c,
                                   CONCAT22(((short)uVar36 < sStack_13e) * uVar36 |
                                            (ushort)((short)uVar36 >= sStack_13e) * sStack_13e,
                                            ((short)uVar34 < sStack_140) * uVar34 |
                                            (ushort)((short)uVar34 >= sStack_140) * sStack_140)));
            local_268 = (short)vNegInfFront[1];
            sStack_266 = (short)((ulong)vNegInfFront[1] >> 0x10);
            sStack_264 = (short)((ulong)vNegInfFront[1] >> 0x20);
            sStack_262 = (short)((ulong)vNegInfFront[1] >> 0x30);
            sStack_260 = (short)vSaturationCheckMax[0];
            sStack_25e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
            sStack_25c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
            sStack_25a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
            vNegInfFront[1] =
                 CONCAT26((sStack_262 < (short)uVar33) * uVar33 |
                          (ushort)(sStack_262 >= (short)uVar33) * sStack_262,
                          CONCAT24((sStack_264 < (short)uVar32) * uVar32 |
                                   (ushort)(sStack_264 >= (short)uVar32) * sStack_264,
                                   CONCAT22((sStack_266 < (short)uVar31) * uVar31 |
                                            (ushort)(sStack_266 >= (short)uVar31) * sStack_266,
                                            (local_268 < (short)uVar27) * uVar27 |
                                            (ushort)(local_268 >= (short)uVar27) * local_268)));
            vSaturationCheckMax[0] =
                 CONCAT26((sStack_25a < (short)uVar38) * uVar38 |
                          (ushort)(sStack_25a >= (short)uVar38) * sStack_25a,
                          CONCAT24((sStack_25c < (short)uVar37) * uVar37 |
                                   (ushort)(sStack_25c >= (short)uVar37) * sStack_25c,
                                   CONCAT22((sStack_25e < (short)uVar36) * uVar36 |
                                            (ushort)(sStack_25e >= (short)uVar36) * sStack_25e,
                                            (sStack_260 < (short)uVar34) * uVar34 |
                                            (ushort)(sStack_260 >= (short)uVar34) * sStack_260)));
            alVar40[0] = (ulong)(uint)k;
            alVar40[1]._0_4_ = iVar28;
            alVar40[1]._4_4_ = 0;
            arr_store_si128(((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                            rowcols->score_row,alVar40,s1Len,s2Len,in_R9D,in_stack_fffffffffffff888)
            ;
          }
        }
        vH_1[0] = ptr_02[(iVar1 + -1) % iVar28][1];
        uStack_748 = ptr_02[(iVar1 + -1) % iVar28][0];
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / iVar28) + 8U);
            end_query = end_query + 1) {
          vH_1[0] = vH_1[0] << 0x10 | uStack_748 >> 0x30;
          uStack_748 = uStack_748 << 0x10;
        }
        local_5fa = vH_1[0]._6_2_;
        local_e8 = (short)vSaturationCheckMax[1];
        sStack_e6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_e4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_e2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_e0 = (short)vSaturationCheckMin[0];
        sStack_de = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_dc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_da = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_b8 = (short)vNegInfFront[1];
        sStack_b6 = (short)((ulong)vNegInfFront[1] >> 0x10);
        sStack_b4 = (short)((ulong)vNegInfFront[1] >> 0x20);
        sStack_b2 = (short)((ulong)vNegInfFront[1] >> 0x30);
        sStack_b0 = (short)vSaturationCheckMax[0];
        sStack_ae = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_ac = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_aa = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar35 = CONCAT26(-(ushort)(sStack_da < (short)uVar25),
                          CONCAT24(-(ushort)(sStack_dc < (short)uVar25),
                                   CONCAT22(-(ushort)(sStack_de < (short)uVar25),
                                            -(ushort)(sStack_e0 < (short)uVar25)))) |
                 CONCAT26(-(ushort)(sVar26 < sStack_aa),
                          CONCAT24(-(ushort)(sVar26 < sStack_ac),
                                   CONCAT22(-(ushort)(sVar26 < sStack_ae),
                                            -(ushort)(sVar26 < sStack_b0))));
        auVar18._8_8_ = uVar35;
        auVar18._0_8_ =
             CONCAT26(-(ushort)(sStack_e2 < (short)uVar25),
                      CONCAT24(-(ushort)(sStack_e4 < (short)uVar25),
                               CONCAT22(-(ushort)(sStack_e6 < (short)uVar25),
                                        -(ushort)(local_e8 < (short)uVar25)))) |
             CONCAT26(-(ushort)(sVar26 < sStack_b2),
                      CONCAT24(-(ushort)(sVar26 < sStack_b4),
                               CONCAT22(-(ushort)(sVar26 < sStack_b6),-(ushort)(sVar26 < local_b8)))
                     );
        if ((((((((((((((((auVar18 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar18 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar18 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar18 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar18 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar18 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar35 >> 7 & 1) != 0) || (uVar35 >> 0xf & 1) != 0) || (uVar35 >> 0x17 & 1) != 0)
               || (uVar35 >> 0x1f & 1) != 0) || (uVar35 >> 0x27 & 1) != 0) ||
             (uVar35 >> 0x2f & 1) != 0) || (uVar35 >> 0x37 & 1) != 0) || (long)uVar35 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_5fa = 0;
          local_560 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_5fa;
        *(int *)((long)&_segNum->s1 + 4) = local_560;
        _segNum->s1Len = matrix._4_4_;
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}